

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_lpf_init(ma_lpf_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                     ma_lpf *pLPF)

{
  ma_result mVar1;
  void *pHeap;
  ma_lpf_heap_layout heapLayout;
  ma_lpf_heap_layout local_40;
  
  mVar1 = ma_lpf_get_heap_layout(pConfig,&local_40);
  if (mVar1 != MA_SUCCESS) {
    return mVar1;
  }
  if (local_40.sizeInBytes == 0) {
    pHeap = (void *)0x0;
LAB_0019a02d:
    if (pLPF == (ma_lpf *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      pLPF->pLPF2 = (ma_lpf2 *)0x0;
      pLPF->_pHeap = (void *)0x0;
      *(undefined8 *)&pLPF->lpf2Count = 0;
      pLPF->pLPF1 = (ma_lpf1 *)0x0;
      pLPF->format = ma_format_unknown;
      pLPF->channels = 0;
      pLPF->sampleRate = 0;
      pLPF->lpf1Count = 0;
      *(undefined8 *)&pLPF->_ownsHeap = 0;
      mVar1 = ma_lpf_reinit__internal(pConfig,pHeap,pLPF,1);
      if (mVar1 == MA_SUCCESS) {
        pLPF->_ownsHeap = 1;
        return MA_SUCCESS;
      }
    }
    ma_free(pHeap,pAllocationCallbacks);
  }
  else {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      pHeap = malloc(local_40.sizeInBytes);
LAB_0019a025:
      if (pHeap != (void *)0x0) goto LAB_0019a02d;
    }
    else if (pAllocationCallbacks->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
      pHeap = (*pAllocationCallbacks->onMalloc)
                        (local_40.sizeInBytes,pAllocationCallbacks->pUserData);
      goto LAB_0019a025;
    }
    mVar1 = MA_OUT_OF_MEMORY;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_lpf_init(const ma_lpf_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_lpf* pLPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_lpf_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_lpf_init_preallocated(pConfig, pHeap, pLPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pLPF->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}